

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::ArrayType::~ArrayType(ArrayType *this)

{
  ArrayType *this_local;
  
  ~ArrayType(this);
  operator_delete(this);
  return;
}

Assistant:

static bool classof(const TypeEntry* entry) {
    return entry->kind() == TypeEntryKind::Array;
  }